

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O0

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::compute<true>(SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                *this,MatrixType *matrix)

{
  SparseMatrix<double,_0,_int> *in_RSI;
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  *in_RDI;
  ConstCholMatrixPtr pmat;
  CholMatrixType tmp;
  Index size;
  SparseMatrix<double,_0,_int> *this_00;
  Index in_stack_ffffffffffffff90;
  CholMatrixType *in_stack_ffffffffffffff98;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffffa0;
  
  SparseMatrix<double,_0,_int>::cols(in_RSI);
  this_00 = (SparseMatrix<double,_0,_int> *)&stack0xffffffffffffffa0;
  SparseMatrix<double,_0,_int>::SparseMatrix
            (in_stack_ffffffffffffffa0,(Index)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  ordering((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            *)tmp.m_outerIndex,(MatrixType *)tmp.m_innerSize,(ConstCholMatrixPtr *)tmp.m_outerSize,
           (CholMatrixType *)tmp._0_8_);
  analyzePattern_preordered(in_RDI,in_stack_ffffffffffffff98,true);
  factorize_preordered<true>(in_RDI,in_stack_ffffffffffffff98);
  SparseMatrix<double,_0,_int>::~SparseMatrix(this_00);
  return;
}

Assistant:

void compute(const MatrixType& matrix)
    {
      eigen_assert(matrix.rows()==matrix.cols());
      Index size = matrix.cols();
      CholMatrixType tmp(size,size);
      ConstCholMatrixPtr pmat;
      ordering(matrix, pmat, tmp);
      analyzePattern_preordered(*pmat, DoLDLT);
      factorize_preordered<DoLDLT>(*pmat);
    }